

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O3

void sptk::world::inv(double **r,int n,double **invr)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int j;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int k_1;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  if (0 < n) {
    uVar12 = (ulong)(uint)n;
    uVar11 = 0;
    do {
      memset(invr[uVar11],0,uVar12 * 8);
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    if (0 < n) {
      uVar11 = 0;
      do {
        invr[uVar11][uVar11] = 1.0;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
      if (0 < n) {
        uVar9 = 1;
        lVar10 = 0;
        uVar11 = uVar12;
        uVar13 = 0;
        do {
          pdVar2 = r[uVar13];
          dVar1 = pdVar2[uVar13];
          pdVar2[uVar13] = 1.0;
          pdVar3 = invr[uVar13];
          uVar6 = 0;
          do {
            pdVar3[uVar6] = pdVar3[uVar6] / dVar1;
            uVar6 = uVar6 + 1;
          } while (uVar9 != uVar6);
          uVar6 = uVar13 + 1;
          if (uVar6 < uVar12) {
            uVar7 = 1;
            do {
              *(double *)((long)pdVar2 + uVar7 * 8 + lVar10) =
                   *(double *)((long)pdVar2 + uVar7 * 8 + lVar10) / dVar1;
              uVar7 = uVar7 + 1;
            } while (uVar11 != uVar7);
            uVar7 = uVar9;
            if (uVar6 < uVar12) {
              do {
                pdVar4 = r[uVar7];
                dVar1 = pdVar4[uVar13];
                pdVar5 = invr[uVar7];
                uVar8 = 0;
                do {
                  pdVar5[uVar8] = pdVar5[uVar8] - pdVar3[uVar8] * dVar1;
                  uVar8 = uVar8 + 1;
                } while (uVar9 != uVar8);
                uVar8 = 0;
                do {
                  *(double *)((long)pdVar4 + uVar8 * 8 + lVar10) =
                       *(double *)((long)pdVar4 + uVar8 * 8 + lVar10) -
                       *(double *)((long)pdVar2 + uVar8 * 8 + lVar10) * dVar1;
                  uVar8 = uVar8 + 1;
                } while (uVar11 != uVar8);
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar12);
            }
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 8;
          uVar11 = uVar11 - 1;
          uVar13 = uVar6;
        } while (uVar6 != uVar12);
        if (0 < n) {
          uVar13 = (ulong)(n - 1);
          uVar11 = uVar12;
          do {
            if (uVar11 < 2) {
              return;
            }
            uVar9 = uVar11 - 1;
            pdVar2 = invr[uVar9];
            uVar6 = 0;
            do {
              dVar1 = r[uVar6][uVar9];
              pdVar3 = invr[uVar6];
              uVar7 = 0;
              do {
                pdVar3[uVar7] = pdVar3[uVar7] - pdVar2[uVar7] * dVar1;
                uVar7 = uVar7 + 1;
              } while (uVar12 != uVar7);
              uVar6 = uVar6 + 1;
            } while (uVar6 != uVar13);
            uVar13 = uVar13 - 1;
            bVar14 = 1 < uVar11;
            uVar11 = uVar9;
          } while (bVar14);
        }
      }
    }
  }
  return;
}

Assistant:

void inv(double **r, int n, double **invr) {
  for (int i = 0; i < n; ++i)
    for (int j = 0; j < n; ++j) invr[i][j] = 0.0;
  for (int i = 0; i < n; ++i) invr[i][i] = 1.0;

  double tmp;
  for (int i = 0; i < n; ++i) {
    tmp = r[i][i];
    r[i][i] = 1.0;
    for (int j = 0; j <= i; ++j) invr[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) r[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) {
      tmp = r[j][i];
      for (int k = 0; k <= i; ++k) invr[j][k] -= invr[i][k] * tmp;
      for (int k = i; k < n; ++k) r[j][k] -= r[i][k] * tmp;
    }
  }

  for (int i = n - 1; i >= 0; --i) {
    for (int j = 0; j < i; ++j) {
      tmp = r[j][i];
      for (int k = 0; k < n; ++k) invr[j][k] -= invr[i][k] * tmp;
    }
  }
}